

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O2

void * __thiscall
chrono::ChClassRegistration<chrono::ChConstraintThreeBBShaft>::create
          (ChClassRegistration<chrono::ChConstraintThreeBBShaft> *this,ChArchiveIn *marchive)

{
  type pvVar1;
  
  pvVar1 = _archive_in_create<chrono::ChConstraintThreeBBShaft>(this,marchive);
  return pvVar1;
}

Assistant:

virtual void* create(ChArchiveIn& marchive) {
        return _archive_in_create(marchive);
    }